

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkClearance.cpp
# Opt level: O1

void __thiscall chrono::ChLinkClearance::ArchiveOUT(ChLinkClearance *this,ChArchiveOut *marchive)

{
  char *local_38;
  double *local_30;
  undefined1 local_28;
  
  ChArchiveOut::VersionWrite<chrono::ChLinkClearance>(marchive);
  ChLinkLockLock::ArchiveOUT(&this->super_ChLinkLockLock,marchive);
  local_30 = &this->clearance;
  local_38 = "clearance";
  local_28 = 0;
  (*(marchive->super_ChArchive)._vptr_ChArchive[4])(marchive,&local_38);
  local_30 = &this->c_friction;
  local_38 = "c_friction";
  local_28 = 0;
  (*(marchive->super_ChArchive)._vptr_ChArchive[4])(marchive,&local_38);
  local_30 = &this->c_restitution;
  local_38 = "c_restitution";
  local_28 = 0;
  (*(marchive->super_ChArchive)._vptr_ChArchive[4])(marchive,&local_38);
  local_30 = &this->diameter;
  local_38 = "diameter";
  local_28 = 0;
  (*(marchive->super_ChArchive)._vptr_ChArchive[4])(marchive,&local_38);
  local_30 = &this->c_tang_restitution;
  local_38 = "c_tang_restitution";
  local_28 = 0;
  (*(marchive->super_ChArchive)._vptr_ChArchive[4])(marchive,&local_38);
  local_30 = &this->c_viscous;
  local_38 = "c_viscous";
  local_28 = 0;
  (*(marchive->super_ChArchive)._vptr_ChArchive[4])(marchive,&local_38);
  return;
}

Assistant:

void ChLinkClearance::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChLinkClearance>();

    // serialize parent class
    ChLinkLockLock::ArchiveOUT(marchive);

    // serialize all member data:
    marchive << CHNVP(clearance);
    marchive << CHNVP(c_friction);
    marchive << CHNVP(c_restitution);
    marchive << CHNVP(diameter);
    marchive << CHNVP(c_tang_restitution);
    marchive << CHNVP(c_viscous);
}